

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_group_begin(nk_context *ctx,char *title,nk_flags flags)

{
  nk_window *win_00;
  int len;
  nk_hash name;
  nk_uint *local_48;
  nk_uint *y_offset;
  nk_uint *x_offset;
  nk_window *win;
  nk_hash title_hash;
  int title_len;
  nk_flags flags_local;
  char *title_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x566b,"int nk_group_begin(struct nk_context *, const char *, nk_flags)");
  }
  if (title == (char *)0x0) {
    __assert_fail("title",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x566c,"int nk_group_begin(struct nk_context *, const char *, nk_flags)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x566d,"int nk_group_begin(struct nk_context *, const char *, nk_flags)");
  }
  if (ctx->current->layout != (nk_panel *)0x0) {
    if ((((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
        (ctx->current->layout == (nk_panel *)0x0)) || (title == (char *)0x0)) {
      ctx_local._4_4_ = 0;
    }
    else {
      win_00 = ctx->current;
      len = nk_strlen(title);
      name = nk_murmur_hash(title,len,2);
      y_offset = nk_find_value(win_00,name);
      if (y_offset == (nk_uint *)0x0) {
        y_offset = nk_add_value(ctx,win_00,name,0);
        local_48 = nk_add_value(ctx,win_00,name + 1,0);
        if (y_offset == (nk_uint *)0x0) {
          __assert_fail("x_offset",
                        "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                        ,0x567b,"int nk_group_begin(struct nk_context *, const char *, nk_flags)");
        }
        if (local_48 == (nk_uint *)0x0) {
          __assert_fail("y_offset",
                        "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                        ,0x567c,"int nk_group_begin(struct nk_context *, const char *, nk_flags)");
        }
        if ((y_offset == (nk_uint *)0x0) || (local_48 == (nk_uint *)0x0)) {
          return 0;
        }
        *local_48 = 0;
        *y_offset = 0;
      }
      else {
        local_48 = nk_find_value(win_00,name + 1);
      }
      ctx_local._4_4_ = nk_group_scrolled_offset_begin(ctx,y_offset,local_48,title,flags);
    }
    return ctx_local._4_4_;
  }
  __assert_fail("ctx->current->layout",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x566e,"int nk_group_begin(struct nk_context *, const char *, nk_flags)");
}

Assistant:

NK_API int
nk_group_begin(struct nk_context *ctx, const char *title, nk_flags flags)
{
    int title_len;
    nk_hash title_hash;
    struct nk_window *win;
    nk_uint *x_offset;
    nk_uint *y_offset;

    NK_ASSERT(ctx);
    NK_ASSERT(title);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !title)
        return 0;

    /* find persistent group scrollbar value */
    win = ctx->current;
    title_len = (int)nk_strlen(title);
    title_hash = nk_murmur_hash(title, (int)title_len, NK_PANEL_GROUP);
    x_offset = nk_find_value(win, title_hash);
    if (!x_offset) {
        x_offset = nk_add_value(ctx, win, title_hash, 0);
        y_offset = nk_add_value(ctx, win, title_hash+1, 0);

        NK_ASSERT(x_offset);
        NK_ASSERT(y_offset);
        if (!x_offset || !y_offset) return 0;
        *x_offset = *y_offset = 0;
    } else y_offset = nk_find_value(win, title_hash+1);
    return nk_group_scrolled_offset_begin(ctx, x_offset, y_offset, title, flags);
}